

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitArrayLen(FunctionValidator *this,ArrayLen *curr)

{
  Type left;
  Type local_30;
  
  shouldBeTrue<wasm::ArrayLen*>
            (this,(bool)((byte)((((this->
                                  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                  ).
                                  super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                  .
                                  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                 .currModule)->features).features >> 10) & 1),curr,
             "array.len requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable<wasm::ArrayLen*,wasm::Type>
            (this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)68>).super_Expression.
                        type.id,(Type)0x2,curr,"array.len result must be an i32");
  left.id = (curr->ref->type).id;
  wasm::Type::Type(&local_30,(HeapType)0x6,Nullable);
  shouldBeSubType(this,left,local_30,(Expression *)curr,
                  "array.len argument must be an array reference");
  return;
}

Assistant:

void FunctionValidator::visitArrayLen(ArrayLen* curr) {
  shouldBeTrue(
    getModule()->features.hasGC(), curr, "array.len requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::i32), curr, "array.len result must be an i32");
  shouldBeSubType(curr->ref->type,
                  Type(HeapType::array, Nullable),
                  curr,
                  "array.len argument must be an array reference");
}